

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonRemoveFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  u32 uVar1;
  JsonParse *p_00;
  uchar *zPath_00;
  int local_34;
  u32 rc;
  int i;
  char *zPath;
  JsonParse *p;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  if ((0 < argc) && (p_00 = jsonParseFuncArg(ctx,*argv,(uint)(1 < argc)), p_00 != (JsonParse *)0x0))
  {
    for (local_34 = 1; local_34 < argc; local_34 = local_34 + 1) {
      zPath_00 = sqlite3_value_text(argv[local_34]);
      if (zPath_00 == (uchar *)0x0) {
LAB_001e50a9:
        jsonParseFree(p_00);
        return;
      }
      if (*zPath_00 != '$') {
        jsonBadPathError(ctx,(char *)zPath_00);
        goto LAB_001e50a9;
      }
      if (zPath_00[1] == '\0') goto LAB_001e50a9;
      p_00->eEdit = '\x01';
      p_00->delta = 0;
      uVar1 = jsonLookupStep(p_00,0,(char *)(zPath_00 + 1),0);
      if ((0xfffffffc < uVar1) && (uVar1 != 0xfffffffe)) {
        if (uVar1 == 0xfffffffd) {
          jsonBadPathError(ctx,(char *)zPath_00);
        }
        else {
          sqlite3_result_error(ctx,"malformed JSON",-1);
        }
        goto LAB_001e50a9;
      }
    }
    jsonReturnParse(ctx,p_00);
    jsonParseFree(p_00);
  }
  return;
}

Assistant:

static void jsonRemoveFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  const char *zPath = 0; /* Path of element to be removed */
  int i;                 /* Loop counter */
  u32 rc;                /* Subroutine return code */

  if( argc<1 ) return;
  p = jsonParseFuncArg(ctx, argv[0], argc>1 ? JSON_EDITABLE : 0);
  if( p==0 ) return;
  for(i=1; i<argc; i++){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    if( zPath==0 ){
      goto json_remove_done;
    }
    if( zPath[0]!='$' ){
      goto json_remove_patherror;
    }
    if( zPath[1]==0 ){
      /* json_remove(j,'$') returns NULL */
      goto json_remove_done;
    }
    p->eEdit = JEDIT_DEL;
    p->delta = 0;
    rc = jsonLookupStep(p, 0, zPath+1, 0);
    if( JSON_LOOKUP_ISERROR(rc) ){
      if( rc==JSON_LOOKUP_NOTFOUND ){
        continue;  /* No-op */
      }else if( rc==JSON_LOOKUP_PATHERROR ){
        jsonBadPathError(ctx, zPath);
      }else{
        sqlite3_result_error(ctx, "malformed JSON", -1);
      }
      goto json_remove_done;
    }
  }
  jsonReturnParse(ctx, p);
  jsonParseFree(p);
  return;

json_remove_patherror:
  jsonBadPathError(ctx, zPath);

json_remove_done:
  jsonParseFree(p);
  return;
}